

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_sequence_insert_after(fy_node *fyn_seq,fy_node *fyn_mark,fy_node *fyn)

{
  _Bool _Var1;
  int ret;
  fy_node *fyn_local;
  fy_node *fyn_mark_local;
  fy_node *fyn_seq_local;
  
  _Var1 = fy_node_sequence_contains_node(fyn_seq,fyn_mark);
  if (_Var1) {
    fyn_seq_local._4_4_ = fy_node_sequence_insert_prepare(fyn_seq,fyn);
    if (fyn_seq_local._4_4_ == 0) {
      fy_node_mark_synthetic(fyn_seq);
      fy_node_list_insert_after(&(fyn_seq->field_12).sequence,fyn_mark,fyn);
      fyn->field_0x34 = fyn->field_0x34 & 0xf7 | 8;
      fyn_seq_local._4_4_ = 0;
    }
  }
  else {
    fyn_seq_local._4_4_ = -1;
  }
  return fyn_seq_local._4_4_;
}

Assistant:

int fy_node_sequence_insert_after(struct fy_node *fyn_seq,
                                  struct fy_node *fyn_mark, struct fy_node *fyn) {
    int ret;

    if (!fy_node_sequence_contains_node(fyn_seq, fyn_mark))
        return -1;

    ret = fy_node_sequence_insert_prepare(fyn_seq, fyn);
    if (ret)
        return ret;

    fy_node_mark_synthetic(fyn_seq);
    fy_node_list_insert_after(&fyn_seq->sequence, fyn_mark, fyn);
    fyn->attached = true;

    return 0;
}